

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectExpander(Walker *pWalker,Select *p)

{
  Expr **ppWhere;
  undefined1 *puVar1;
  char **ppcVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  Parse *pParse;
  sqlite3 *db;
  SrcList *pList;
  ExprList *pList_00;
  SrcList *pSrc;
  ExprList_item *pEVar6;
  Column *pCVar7;
  bool bVar8;
  int iVar9;
  Table *pTVar10;
  Select *pSVar11;
  Table **ppTVar12;
  Expr *pEVar13;
  Expr *pEVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  char *z2;
  byte *pbVar18;
  char *pcVar19;
  SrcList_item *pSVar20;
  byte *zTab;
  int i;
  SrcList *pSVar21;
  long lVar22;
  ExprList_item *pEVar23;
  Select *pSVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  Schema **ppSVar28;
  byte *pbVar29;
  int iVar30;
  long lVar31;
  short sVar32;
  Table **ppTVar33;
  long lVar34;
  long lVar35;
  short sVar36;
  Select *local_d8;
  byte *local_d0;
  ExprList *local_c8;
  char *local_b8;
  uint local_a0;
  ExprList_item *a;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar5 = p->selFlags;
  p->selFlags = uVar5 | 0x10;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pList = p->pSrc;
  if ((uVar5 & 0x10) != 0 || pList == (SrcList *)0x0) {
    return 1;
  }
  pList_00 = p->pEList;
  sqlite3SrcListAssignCursors(pParse,pList);
  if (0 < pList->nSrc) {
    iVar30 = 0;
    pSVar20 = pList->a;
    do {
      if (pSVar20->pTab != (Table *)0x0) {
        return 1;
      }
      if (pSVar20->zName == (char *)0x0) {
        pSVar11 = pSVar20->pSelect;
        sqlite3WalkSelect(pWalker,pSVar11);
        pTVar10 = (Table *)sqlite3DbMallocRaw(db,0x78);
        if (pTVar10 == (Table *)0x0) goto LAB_0015b73f;
        pTVar10->pTrigger = (Trigger *)0x0;
        pTVar10->pSchema = (Schema *)0x0;
        pTVar10->azModuleArg = (char **)0x0;
        pTVar10->pVTable = (VTable *)0x0;
        pTVar10->iPKey = 0;
        pTVar10->nCol = 0;
        pTVar10->nRef = 0;
        pTVar10->tabFlags = '\0';
        pTVar10->keyConf = '\0';
        pTVar10->addColOffset = 0;
        pTVar10->nModuleArg = 0;
        pTVar10->pCheck = (ExprList *)0x0;
        pTVar10->nRowEst = 0;
        pTVar10->tnum = 0;
        pTVar10->pFKey = (FKey *)0x0;
        pTVar10->zColAff = (char *)0x0;
        pTVar10->pIndex = (Index *)0x0;
        pTVar10->pSelect = (Select *)0x0;
        pTVar10->zName = (char *)0x0;
        pTVar10->aCol = (Column *)0x0;
        pTVar10->pNextZombie = (Table *)0x0;
        pSVar20->pTab = pTVar10;
        pTVar10->nRef = 1;
        pcVar16 = sqlite3MPrintf(db,"sqlite_subquery_%p_",pTVar10);
        pTVar10->zName = pcVar16;
        do {
          pSVar24 = pSVar11;
          pSVar11 = pSVar24->pPrior;
        } while (pSVar11 != (Select *)0x0);
        selectColumnsFromExprList((Parse *)pParse->db,pSVar24->pEList,&pTVar10->nCol,&pTVar10->aCol)
        ;
        pTVar10->iPKey = -1;
        pTVar10->nRowEst = 1000000;
        pTVar10->tabFlags = pTVar10->tabFlags | 2;
      }
      else {
        pTVar10 = sqlite3LocateTableItem(pParse,0,pSVar20);
        pSVar20->pTab = pTVar10;
        if (pTVar10 == (Table *)0x0) {
          return 2;
        }
        if (pTVar10->nRef == 0xffff) {
          sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar10->zName);
LAB_0015b73f:
          pSVar20->pTab = (Table *)0x0;
          return 2;
        }
        pTVar10->nRef = pTVar10->nRef + 1;
        if ((pTVar10->pSelect != (Select *)0x0) || ((pTVar10->tabFlags & 0x10) != 0)) {
          iVar9 = sqlite3ViewGetColumnNames(pParse,pTVar10);
          if (iVar9 != 0) {
            return 2;
          }
          pSVar11 = sqlite3SelectDup(db,pTVar10->pSelect,0);
          pSVar20->pSelect = pSVar11;
          sqlite3WalkSelect(pWalker,pSVar11);
        }
      }
      iVar9 = sqlite3IndexedByLookup(pParse,pSVar20);
      if (iVar9 != 0) {
        return 2;
      }
      iVar30 = iVar30 + 1;
      pSVar20 = pSVar20 + 1;
    } while (iVar30 < pList->nSrc);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSrc = p->pSrc;
  if (1 < pSrc->nSrc) {
    pSVar20 = pSrc->a;
    pSVar21 = pSrc + 1;
    ppWhere = &p->pWhere;
    ppTVar12 = &pSrc->a[0].pTab;
    lVar25 = 0;
    do {
      pTVar10 = (Table *)pSVar21->a[0].zAlias;
      if (pTVar10 != (Table *)0x0 && pSVar20->pTab != (Table *)0x0) {
        bVar4 = (byte)pSVar21->a[0].addrFillSub;
        uVar17 = (bVar4 & 0x20) >> 5;
        if ((bVar4 & 4) != 0) {
          lVar34._0_1_ = pSVar21->a[0].jointype;
          lVar34._1_1_ = pSVar21->a[0].field_0x39;
          lVar34._2_1_ = pSVar21->a[0].iSelectId;
          lVar34._3_1_ = pSVar21->a[0].field_0x3b;
          lVar34._4_4_ = pSVar21->a[0].iCursor;
          if ((lVar34 != 0) || (pSVar21->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            return 2;
          }
          sVar36 = pTVar10->nCol;
          if (0 < sVar36) {
            lVar34 = 0;
            do {
              pcVar16 = pTVar10->aCol[lVar34].zName;
              lVar22 = 0;
              ppTVar33 = ppTVar12;
              do {
                iVar30 = columnIndex(*ppTVar33,pcVar16);
                if (-1 < iVar30) {
                  addWhereTerm(pParse,pSrc,(int)lVar22,iVar30,(int)lVar25 + 1,(int)lVar34,uVar17,
                               ppWhere);
                  sVar36 = pTVar10->nCol;
                  break;
                }
                lVar22 = lVar22 + 1;
                ppTVar33 = ppTVar33 + 0xd;
              } while (lVar25 + 1 != lVar22);
              lVar34 = lVar34 + 1;
            } while (lVar34 < sVar36);
          }
        }
        pEVar13 = *(Expr **)&pSVar21->a[0].jointype;
        if (pEVar13 != (Expr *)0x0) {
          if (pSVar21->a[0].pOn != (Expr *)0x0) {
            sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
            return 2;
          }
          if ((bVar4 & 0x20) != 0) {
            setJoinExpr(pEVar13,pSVar21->a[0].regReturn);
            pEVar13 = *(Expr **)&pSVar21->a[0].jointype;
          }
          pEVar13 = sqlite3ExprAnd(pParse->db,*ppWhere,pEVar13);
          *ppWhere = pEVar13;
          pSVar21->a[0].jointype = '\0';
          pSVar21->a[0].field_0x39 = 0;
          pSVar21->a[0].iSelectId = '\0';
          pSVar21->a[0].field_0x3b = 0;
          pSVar21->a[0].iCursor = 0;
        }
        pEVar13 = pSVar21->a[0].pOn;
        if ((pEVar13 != (Expr *)0x0) && (0 < (pEVar13->u).iValue)) {
          lVar34 = 0;
          do {
            pcVar16 = *(char **)(*(long *)pEVar13 + lVar34 * 0x10);
            iVar30 = columnIndex(pTVar10,pcVar16);
            if (iVar30 < 0) {
LAB_0015b749:
              sqlite3ErrorMsg(pParse,
                              "cannot join using column %s - column not present in both tables",
                              pcVar16);
              return 2;
            }
            lVar22 = 0;
            ppTVar33 = ppTVar12;
            while (iVar9 = columnIndex(*ppTVar33,pcVar16), iVar9 < 0) {
              lVar22 = lVar22 + 1;
              ppTVar33 = ppTVar33 + 0xd;
              if (lVar25 + 1 == lVar22) goto LAB_0015b749;
            }
            addWhereTerm(pParse,pSrc,(int)lVar22,iVar9,(int)lVar25 + 1,iVar30,uVar17,ppWhere);
            lVar34 = lVar34 + 1;
          } while (lVar34 < (pEVar13->u).iValue);
        }
      }
      lVar25 = lVar25 + 1;
      pSVar21 = (SrcList *)&pSVar21->a[0].pIndex;
      pSVar20 = pSVar20 + 1;
    } while (lVar25 < (long)pSrc->nSrc + -1);
  }
  if (0 < (long)pList_00->nExpr) {
    pEVar6 = pList_00->a;
    lVar25 = 0;
    do {
      pcVar16 = *(char **)((long)&pEVar6->pExpr + lVar25);
      cVar3 = *pcVar16;
      if (cVar3 == 'v') {
        cVar3 = **(char **)(pcVar16 + 0x18);
      }
      if (cVar3 == 'q') {
        local_a0 = pParse->db->flags & 0xc;
        lVar25 = 0;
        local_c8 = (ExprList *)0x0;
        goto LAB_0015b796;
      }
      lVar25 = lVar25 + 0x20;
    } while ((long)pList_00->nExpr * 0x20 != lVar25);
  }
  local_c8 = p->pEList;
  goto LAB_0015bcf3;
LAB_0015b796:
  do {
    pEVar13 = pEVar6[lVar25].pExpr;
    if (pEVar13->op == 'q') {
      zTab = (byte *)0x0;
LAB_0015b81f:
      sVar36 = pList->nSrc;
      if (0 < sVar36) {
        lVar34 = 0;
        lVar22 = 0;
        bVar8 = false;
        pSVar20 = pList->a;
        do {
          local_d0 = (byte *)pSVar20->zAlias;
          pTVar10 = pSVar20->pTab;
          if (local_d0 == (byte *)0x0) {
            local_d0 = (byte *)pTVar10->zName;
          }
          if (db->mallocFailed != '\0') break;
          local_d8 = pSVar20->pSelect;
          if ((local_d8 == (Select *)0x0) || ((local_d8->selFlags & 0x200) == 0)) {
            if (zTab == (byte *)0x0) {
LAB_0015b8fa:
              if (pTVar10->pSchema == (Schema *)0x0) {
LAB_0015b934:
                local_d8 = (Select *)0x0;
                local_b8 = "*";
              }
              else {
                uVar17 = db->nDb;
                if ((int)uVar17 < 1) {
                  uVar17 = 0;
                }
                else {
                  ppSVar28 = &db->aDb->pSchema;
                  uVar26 = 0;
                  do {
                    uVar27 = uVar26;
                    if (*ppSVar28 == pTVar10->pSchema) break;
                    uVar26 = uVar26 + 1;
                    ppSVar28 = ppSVar28 + 4;
                    uVar27 = (ulong)uVar17;
                  } while (uVar17 != uVar26);
                  uVar17 = (uint)uVar27;
                  if ((int)uVar17 < 0) goto LAB_0015b934;
                }
                local_b8 = db->aDb[uVar17].zName;
                local_d8 = (Select *)0x0;
              }
              goto LAB_0015b965;
            }
            bVar4 = *zTab;
            pbVar29 = zTab;
            pbVar18 = local_d0;
            while (bVar4 != 0) {
              pbVar29 = pbVar29 + 1;
              uVar26 = (ulong)bVar4;
              if (""[uVar26] != ""[*pbVar18]) goto LAB_0015b8e9;
              pbVar18 = pbVar18 + 1;
              bVar4 = *pbVar29;
            }
            uVar26 = 0;
LAB_0015b8e9:
            if (""[uVar26] == ""[*pbVar18]) goto LAB_0015b8fa;
          }
          else {
            local_b8 = (char *)0x0;
LAB_0015b965:
            sVar32 = pTVar10->nCol;
            if (0 < sVar32) {
              lVar31 = 0;
              do {
                pCVar7 = pTVar10->aCol;
                pcVar16 = pCVar7[lVar31].zName;
                if (((local_d8 == (Select *)0x0 || zTab == (byte *)0x0) ||
                    (iVar30 = sqlite3MatchSpanName
                                        (local_d8->pEList->a[lVar31].zSpan,(char *)0x0,(char *)zTab,
                                         (char *)0x0), iVar30 != 0)) &&
                   ((pCVar7[lVar31].colFlags & 2) == 0)) {
                  if (lVar22 == 0 || zTab != (byte *)0x0) {
LAB_0015ba54:
                    pEVar13 = sqlite3Expr(db,0x1a,pcVar16);
                    if ((local_a0 == 4) || (1 < pList->nSrc)) {
                      pEVar14 = sqlite3Expr(db,0x1a,(char *)local_d0);
                      pEVar13 = sqlite3PExpr(pParse,0x76,pEVar14,pEVar13,(Token *)0x0);
                      if (local_b8 != (char *)0x0) {
                        sColname.z = local_b8;
                        uVar17 = 0xffffffff;
                        pcVar15 = local_b8;
                        do {
                          uVar17 = uVar17 + 1;
                          cVar3 = *pcVar15;
                          pcVar15 = pcVar15 + 1;
                        } while (cVar3 != '\0');
                        sColname.n = uVar17 & 0x3fffffff;
                        pEVar14 = sqlite3ExprAlloc(db,0x1a,&sColname,0);
                        pEVar13 = sqlite3PExpr(pParse,0x76,pEVar14,pEVar13,(Token *)0x0);
                      }
                      if (local_a0 != 4) goto LAB_0015bb3f;
                      pcVar15 = sqlite3MPrintf(db,"%s.%s",local_d0);
                      pcVar16 = pcVar15;
                    }
                    else {
LAB_0015bb3f:
                      pcVar15 = (char *)0x0;
                    }
                    local_c8 = sqlite3ExprListAppend((Parse *)pParse->db,local_c8,pEVar13);
                    if (pcVar16 == (char *)0x0) {
                      sColname.n = 0;
                    }
                    else {
                      uVar17 = 0xffffffff;
                      pcVar19 = pcVar16;
                      do {
                        uVar17 = uVar17 + 1;
                        cVar3 = *pcVar19;
                        pcVar19 = pcVar19 + 1;
                      } while (cVar3 != '\0');
                      sColname.n = uVar17 & 0x3fffffff;
                    }
                    sColname.z = pcVar16;
                    sqlite3ExprListSetName(pParse,local_c8,&sColname,0);
                    if ((local_c8 != (ExprList *)0x0) && ((p->selFlags & 0x200) != 0)) {
                      iVar30 = local_c8->nExpr;
                      pEVar23 = local_c8->a;
                      if (local_d8 == (Select *)0x0) {
                        pcVar16 = sqlite3MPrintf(db,"%s.%s.%s",local_b8);
                      }
                      else {
                        pcVar16 = sqlite3DbStrDup(db,local_d8->pEList->a[lVar31].zSpan);
                      }
                      pEVar23[(long)iVar30 + -1].zSpan = pcVar16;
                      puVar1 = &pEVar23[(long)iVar30 + -1].field_0x19;
                      *puVar1 = *puVar1 | 2;
                    }
                    sqlite3DbFree(db,pcVar15);
                    sVar32 = pTVar10->nCol;
                  }
                  else {
                    if ((pSVar20->jointype & 4) != 0) {
                      lVar35 = 0;
                      do {
                        iVar30 = columnIndex(*(Table **)((long)&pList->a[0].pTab + lVar35),pcVar16);
                        if (-1 < iVar30) goto LAB_0015bc2c;
                        lVar35 = lVar35 + 0x68;
                      } while (lVar34 != lVar35);
                    }
                    iVar30 = sqlite3IdListIndex(pSVar20->pUsing,pcVar16);
                    if (iVar30 < 0) goto LAB_0015ba54;
                  }
LAB_0015bc2c:
                  bVar8 = true;
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 < sVar32);
              sVar36 = pList->nSrc;
            }
          }
          lVar22 = lVar22 + 1;
          pSVar20 = pSVar20 + 1;
          lVar34 = lVar34 + 0x68;
        } while (lVar22 < sVar36);
        if (bVar8) goto LAB_0015bcc4;
      }
      if (zTab == (byte *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s");
      }
    }
    else {
      if ((pEVar13->op == 'v') && (pEVar13->pRight->op == 'q')) {
        zTab = (byte *)(pEVar13->pLeft->u).zToken;
        goto LAB_0015b81f;
      }
      pEVar23 = pEVar6 + lVar25;
      local_c8 = sqlite3ExprListAppend((Parse *)pParse->db,local_c8,pEVar13);
      if (local_c8 != (ExprList *)0x0) {
        pcVar16 = pEVar23->zSpan;
        ppcVar2 = &local_c8->a[(long)local_c8->nExpr + -1].zName;
        *ppcVar2 = pEVar23->zName;
        ppcVar2[1] = pcVar16;
        pEVar23->zName = (char *)0x0;
        pEVar23->zSpan = (char *)0x0;
      }
      pEVar23->pExpr = (Expr *)0x0;
    }
LAB_0015bcc4:
    lVar25 = lVar25 + 1;
  } while (lVar25 < pList_00->nExpr);
  sqlite3ExprListDelete(db,pList_00);
  p->pEList = local_c8;
LAB_0015bcf3:
  if ((local_c8 != (ExprList *)0x0) && (db->aLimit[2] < local_c8->nExpr)) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    if( pFrom->pTab!=0 ){
      /* This statement has already been prepared.  There is no need
      ** to go further. */
      assert( i==0 );
      return WRC_Prune;
    }
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      sqlite3WalkSelect(pWalker, pSel);
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_subquery_%p_", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      selectColumnsFromExprList(pParse, pSel->pEList, &pTab->nCol, &pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowEst = 1000000;
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nRef==0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nRef++;
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( pTab->pSelect || IsVirtual(pTab) ){
        /* We reach here if the named table is a really a view */
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ALL operator for each "*" that it found in the column list.
  ** The following code just has to locate the TK_ALL expressions and expand
  ** each one to the list of all columns in all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ALL ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ALL ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    /* When processing FROM-clause subqueries, it is always the case
    ** that full_column_names=OFF and short_column_names=ON.  The
    ** sqlite3ResultSetOfSelect() routine makes it so. */
    assert( (p->selFlags & SF_NestedFrom)==0
          || ((flags & SQLITE_FullColNames)==0 &&
              (flags & SQLITE_ShortColNames)!=0) );

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ALL && (pE->op!=TK_DOT || pRight->op!=TK_ALL) ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden' (currently only possible
            ** for virtual tables), do not include it in the expanded
            ** result-set list.
            */
            if( IsHiddenColumn(&pTab->aCol[j]) ){
              assert(IsVirtual(pTab));
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight, 0);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr, 0);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sColname.z = zColname;
            sColname.n = sqlite3Strlen30(zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
  }
#endif
  return WRC_Continue;
}